

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O0

void __thiscall lineage::SolutionGraph::saveSVG(SolutionGraph *this,string *fileName)

{
  bool bVar1;
  size_t sVar2;
  reference pvVar3;
  unsigned_long uVar4;
  Problem *this_00;
  const_reference pvVar5;
  ulong uVar6;
  ostream *poVar7;
  size_type sVar8;
  reference pvVar9;
  size_t __n;
  string *in_RSI;
  long in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  size_t cell1;
  size_t cell0;
  size_t e;
  size_t t;
  size_t j;
  size_t yScale;
  size_t xScale;
  ofstream file;
  VertexIterator it;
  int tNode;
  unsigned_long *node;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  value_type cell;
  size_t xOffset;
  size_t v;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> cells;
  vector<CellLine,_std::allocator<CellLine>_> cellLines;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffab8;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffac0;
  ostream *in_stack_fffffffffffffad0;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffad8;
  vector<CellLine,_std::allocator<CellLine>_> *in_stack_fffffffffffffae0;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  ostream local_2e8 [512];
  value_type local_e8;
  int local_cc;
  size_type *local_c8;
  unsigned_long *local_c0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b8;
  const_reference local_b0;
  size_type local_a8;
  size_t local_a0;
  ulong local_98;
  vector<CellLine,_std::allocator<CellLine>_> local_28;
  string *local_10;
  
  local_10 = in_RSI;
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
            ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x189a90);
  std::allocator<CellLine>::allocator((allocator<CellLine> *)0x189aad);
  std::vector<CellLine,_std::allocator<CellLine>_>::vector
            (in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8,
             (allocator_type *)in_stack_fffffffffffffad0);
  std::allocator<CellLine>::~allocator((allocator<CellLine> *)0x189ad9);
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             in_stack_fffffffffffffac0);
  for (local_98 = 0; uVar6 = local_98,
      sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x189b15)
      , uVar6 < sVar2; local_98 = local_98 + 1) {
    sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
            numberOfEdgesToVertex(in_stack_fffffffffffffac0,(size_t)in_stack_fffffffffffffab8);
    if (sVar2 == 0) {
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )in_stack_fffffffffffffac0,(value_type *)in_stack_fffffffffffffab8);
    }
  }
  local_a0 = 0;
  while (bVar1 = std::
                 stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                 empty((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)0x189c0c), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
             top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )0x189c34);
    local_a8 = *pvVar3;
    std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               0x189c5e);
    sVar2 = local_a0;
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_a8);
    pvVar9->x = sVar2;
    uVar4 = std::numeric_limits<unsigned_long>::max();
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_a8);
    pvVar9->tMin = uVar4;
    uVar4 = std::numeric_limits<unsigned_long>::max();
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_a8);
    pvVar9->tMax = -uVar4;
    local_b0 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RDI + 0x60),local_a8);
    local_b8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffab8);
    local_c0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_fffffffffffffab8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffac0,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffab8), bVar1) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_b8);
      this_00 = problem((SolutionGraph *)0x189d7f);
      pvVar5 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                         (&this_00->nodes,*local_c8);
      local_cc = pvVar5->t;
      uVar6 = (ulong)local_cc;
      pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_a8);
      if (uVar6 < pvVar9->tMin) {
        sVar2 = (size_t)local_cc;
        pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_a8);
        pvVar9->tMin = sVar2;
      }
      uVar6 = (ulong)local_cc;
      pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_a8);
      if (pvVar9->tMax < uVar6) {
        sVar2 = (size_t)local_cc;
        pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_a8);
        pvVar9->tMax = sVar2;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_b8);
    }
    sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
            numberOfEdgesFromVertex(in_stack_fffffffffffffac0,(size_t)in_stack_fffffffffffffab8);
    if (sVar2 == 0) {
      local_a0 = local_a0 + 1;
    }
    else {
      andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
      verticesFromVertexBegin(in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
      while( true ) {
        andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
        verticesFromVertexEnd(in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffac0,
                           (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffab8);
        if (!bVar1) break;
        local_e8 = andres::graph::detail::IteratorHelper<true>::operator*
                             ((IteratorHelper<true> *)0x189f25);
        std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffffac0,(value_type *)in_stack_fffffffffffffab8);
        andres::graph::detail::IteratorHelper<true>::operator++
                  ((IteratorHelper<true> *)in_stack_fffffffffffffac0);
      }
    }
  }
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             0x189f7e);
  std::ofstream::ofstream(local_2e8,local_10,_S_out);
  poVar7 = std::operator<<(local_2e8,"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\"?>")
  ;
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7,"<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" ");
  poVar7 = std::operator<<(poVar7,"\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7,"<svg version=\"1.1\" xmlns=\"http://www.w3.org/2000/svg\" ");
  poVar7 = std::operator<<(poVar7,"xmlns:xlink=\"http://www.w3.org/1999/xlink\"");
  poVar7 = std::operator<<(poVar7,">");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  for (local_300 = 0; sVar8 = std::vector<CellLine,_std::allocator<CellLine>_>::size(&local_28),
      local_300 < sVar8; local_300 = local_300 + 1) {
    poVar7 = std::operator<<(local_2e8,"<line x1=\"");
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_300);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar9->x * 10);
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7," y1=\"");
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_300);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar9->tMin * 5);
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7," x2=\"");
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_300);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar9->x * 10);
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7," y2=\"");
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_300);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar9->tMax * 5);
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7," style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_300);
    for (local_308 = pvVar9->tMin;
        pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_300),
        local_308 <= pvVar9->tMax; local_308 = local_308 + 1) {
      poVar7 = std::operator<<(local_2e8,"<line x1=\"");
      pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_300);
      sVar2 = pvVar9->x;
      auVar10._8_4_ = (int)(sVar2 >> 0x20);
      auVar10._0_8_ = sVar2;
      auVar10._12_4_ = 0x45300000;
      auVar12._0_12_ = ZEXT812(10);
      auVar12._12_4_ = 0x45300000;
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,((auVar10._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                                 -0.2) * ((auVar12._8_8_ - 1.9342813113834067e+25) + 10.0));
      poVar7 = std::operator<<(poVar7,"\"");
      poVar7 = std::operator<<(poVar7," y1=\"");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_308 * 5);
      poVar7 = std::operator<<(poVar7,"\"");
      poVar7 = std::operator<<(poVar7," x2=\"");
      pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,local_300);
      sVar2 = pvVar9->x;
      auVar11._8_4_ = (int)(sVar2 >> 0x20);
      auVar11._0_8_ = sVar2;
      auVar11._12_4_ = 0x45300000;
      auVar13._0_12_ = ZEXT812(10);
      auVar13._12_4_ = 0x45300000;
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,((auVar11._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                                 0.2) * ((auVar13._8_8_ - 1.9342813113834067e+25) + 10.0));
      poVar7 = std::operator<<(poVar7,"\"");
      poVar7 = std::operator<<(poVar7," y2=\"");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_308 * 5);
      poVar7 = std::operator<<(poVar7,"\"");
      poVar7 = std::operator<<(poVar7," style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  for (local_310 = 0;
      sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
                        ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x18a661),
      local_310 < sVar2; local_310 = local_310 + 1) {
    sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                      (in_stack_fffffffffffffac0,(size_t)in_stack_fffffffffffffab8,0x18a6a1);
    __n = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                    (in_stack_fffffffffffffac0,(size_t)in_stack_fffffffffffffab8,0x18a6d3);
    poVar7 = std::operator<<(local_2e8,"<line x1=\"");
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,sVar2);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar9->x * 10);
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7," y1=\"");
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,sVar2);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar9->tMax * 5);
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7," x2=\"");
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,__n);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar9->x * 10);
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7," y2=\"");
    pvVar9 = std::vector<CellLine,_std::allocator<CellLine>_>::operator[](&local_28,__n);
    in_stack_fffffffffffffad0 = (ostream *)std::ostream::operator<<(poVar7,pvVar9->tMin * 5);
    poVar7 = std::operator<<(in_stack_fffffffffffffad0,"\"");
    in_stack_fffffffffffffac0 =
         (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
         std::operator<<(poVar7," style=\"stroke:rgb(0, 153, 0); stroke-width:1pt;\"/>");
    std::ostream::operator<<(in_stack_fffffffffffffac0,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<(local_2e8,"</svg>\n");
  std::ofstream::close();
  std::ofstream::~ofstream(local_2e8);
  std::vector<CellLine,_std::allocator<CellLine>_>::~vector
            ((vector<CellLine,_std::allocator<CellLine>_> *)in_stack_fffffffffffffad0);
  return;
}

Assistant:

void saveSVG(std::string const& fileName = "lineage") const
    {
        struct CellLine
        {
            size_t x;
            size_t tMin;
            size_t tMax;
        };

        std::vector<CellLine> cellLines(lineageGraph_.numberOfVertices());

        {
            std::stack<size_t> cells;

            // put all roots on the stack
            for (size_t v = 0; v < lineageGraph_.numberOfVertices(); ++v)
                if (lineageGraph_.numberOfEdgesToVertex(v) == 0)
                    cells.push(v);

            size_t xOffset = 0;
            while (!cells.empty())
            {
                auto cell = cells.top();
                cells.pop();

                cellLines[cell].x = xOffset;
                cellLines[cell].tMin = std::numeric_limits<size_t>::max();
                cellLines[cell].tMax = -std::numeric_limits<size_t>::max();

                for (auto& node : nodesOfCell_[cell])
                {
                    auto tNode = problem().nodes[node].t;
                    if (tNode < cellLines[cell].tMin)
                        cellLines[cell].tMin = tNode;
                    
                    if (tNode > cellLines[cell].tMax)
                        cellLines[cell].tMax = tNode;
                }

                if (lineageGraph_.numberOfEdgesFromVertex(cell) == 0) // if leaf
                    ++xOffset;
                else 
                    for(auto it = lineageGraph_.verticesFromVertexBegin(cell); it != lineageGraph_.verticesFromVertexEnd(cell); ++it)
                        cells.push(*it);
            }
        }

        std::ofstream file(fileName);

        // print header
        file << "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\"?>"
            << std::endl
            << "<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" "
            << "\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">"
            << std::endl
            << "<svg version=\"1.1\" xmlns=\"http://www.w3.org/2000/svg\" "
            << "xmlns:xlink=\"http://www.w3.org/1999/xlink\""
            // << " width=" << ???
            // << " height=" << ???
            << ">"
            << std::endl;

        size_t xScale = 10;
        size_t yScale = 5;
        for (size_t j = 0; j < cellLines.size(); ++j)
        {
            // draw line from (xOffset, tMin) to (xOffset, tMax)
            file << "<line x1=\"" << cellLines[j].x * xScale << "\""
                << " y1=\"" << cellLines[j].tMin * yScale<< "\""
                << " x2=\"" << cellLines[j].x * xScale << "\""
                << " y2=\"" << cellLines[j].tMax * yScale << "\""
                << " style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>"
                << std::endl;

            for (size_t t = cellLines[j].tMin; t <= cellLines[j].tMax; ++t)
                file << "<line x1=\"" << (cellLines[j].x - 0.2) * xScale << "\""
                    << " y1=\"" << t * yScale<< "\""
                    << " x2=\"" << (cellLines[j].x + 0.2) * xScale << "\""
                    << " y2=\"" << t * yScale << "\""
                    << " style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>"
                    << std::endl;
        }

        for (size_t e = 0; e < lineageGraph_.numberOfEdges(); ++e)
        {
            auto cell0 = lineageGraph_.vertexOfEdge(e, 0);
            auto cell1 = lineageGraph_.vertexOfEdge(e, 1);

            file << "<line x1=\"" << cellLines[cell0].x * xScale << "\""
                << " y1=\"" << cellLines[cell0].tMax * yScale<< "\""
                << " x2=\"" << cellLines[cell1].x * xScale << "\""
                << " y2=\"" << cellLines[cell1].tMin * yScale << "\""
                << " style=\"stroke:rgb(0, 153, 0); stroke-width:1pt;\"/>"
                << std::endl;
        }

        // print footer
        file << "</svg>\n";

        file.close();
    }